

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

bool __thiscall duckdb::HashJoinLocalSourceState::TaskFinished(HashJoinLocalSourceState *this)

{
  HashJoinSourceStage HVar1;
  InternalException *this_00;
  byte bVar2;
  allocator local_39;
  string local_38;
  
  HVar1 = this->local_stage;
  bVar2 = true;
  if (BUILD < HVar1) {
    if (HVar1 == SCAN_HT) {
      bVar2 = (this->full_outer_scan_state).
              super_unique_ptr<duckdb::JoinHTScanState,_std::default_delete<duckdb::JoinHTScanState>_>
              ._M_t.
              super___uniq_ptr_impl<duckdb::JoinHTScanState,_std::default_delete<duckdb::JoinHTScanState>_>
              ._M_t.
              super__Tuple_impl<0UL,_duckdb::JoinHTScanState_*,_std::default_delete<duckdb::JoinHTScanState>_>
              .super__Head_base<0UL,_duckdb::JoinHTScanState_*,_false>._M_head_impl ==
              (JoinHTScanState *)0x0;
    }
    else {
      if (HVar1 != PROBE) {
        this_00 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_38,"Unexpected HashJoinSourceStage in TaskFinished!",&local_39);
        InternalException::InternalException(this_00,&local_38);
        __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar2 = (this->empty_ht_probe_in_progress ^ 1U) & (this->scan_structure).is_null;
    }
  }
  return (bool)bVar2;
}

Assistant:

bool HashJoinLocalSourceState::TaskFinished() const {
	switch (local_stage) {
	case HashJoinSourceStage::INIT:
	case HashJoinSourceStage::BUILD:
		return true;
	case HashJoinSourceStage::PROBE:
		return scan_structure.is_null && !empty_ht_probe_in_progress;
	case HashJoinSourceStage::SCAN_HT:
		return full_outer_scan_state == nullptr;
	default:
		throw InternalException("Unexpected HashJoinSourceStage in TaskFinished!");
	}
}